

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 getSafetyLevel(char *z,int omitFull,u8 dflt)

{
  int iVar1;
  uint N;
  int local_24;
  int n;
  int i;
  u8 dflt_local;
  int omitFull_local;
  char *z_local;
  
  if ((""[(byte)*z] & 4) == 0) {
    N = sqlite3Strlen30(z);
    for (local_24 = 0; z_local._7_1_ = dflt, local_24 < 8; local_24 = local_24 + 1) {
      if ((("\x02\x02\x03\x05\x03\x04\x05\x04"[local_24] == N) &&
          (iVar1 = sqlite3_strnicmp("onoffalseyestruextrafull" + ""[local_24],z,N), iVar1 == 0)) &&
         ((omitFull == 0 || ("\x01"[local_24] < 2)))) {
        return "\x01"[local_24];
      }
    }
  }
  else {
    iVar1 = sqlite3Atoi(z);
    z_local._7_1_ = (u8)iVar1;
  }
  return z_local._7_1_;
}

Assistant:

static u8 getSafetyLevel(const char *z, int omitFull, u8 dflt){
                             /* 123456789 123456789 123 */
  static const char zText[] = "onoffalseyestruextrafull";
  static const u8 iOffset[] = {0, 1, 2,  4,    9,  12,  15,   20};
  static const u8 iLength[] = {2, 2, 3,  5,    3,   4,   5,    4};
  static const u8 iValue[] =  {1, 0, 0,  0,    1,   1,   3,    2};
                            /* on no off false yes true extra full */
  int i, n;
  if( sqlite3Isdigit(*z) ){
    return (u8)sqlite3Atoi(z);
  }
  n = sqlite3Strlen30(z);
  for(i=0; i<ArraySize(iLength); i++){
    if( iLength[i]==n && sqlite3StrNICmp(&zText[iOffset[i]],z,n)==0
     && (!omitFull || iValue[i]<=1)
    ){
      return iValue[i];
    }
  }
  return dflt;
}